

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CodeGeneratorTest_GetUnresolvedSourceFeaturesRoot_Test::
~CodeGeneratorTest_GetUnresolvedSourceFeaturesRoot_Test
          (CodeGeneratorTest_GetUnresolvedSourceFeaturesRoot_Test *this)

{
  CodeGeneratorTest_GetUnresolvedSourceFeaturesRoot_Test *this_local;
  
  ~CodeGeneratorTest_GetUnresolvedSourceFeaturesRoot_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(CodeGeneratorTest, GetUnresolvedSourceFeaturesRoot) {
  ASSERT_THAT(BuildFile(DescriptorProto::descriptor()->file()), NotNull());
  ASSERT_THAT(BuildFile(pb::TestMessage::descriptor()->file()), NotNull());
  auto file = BuildFile(R"schema(
    edition = "2023";
    package proto2_unittest;

    import "google/protobuf/unittest_features.proto";

    option features.field_presence = EXPLICIT;  // 2023 default
    option features.enum_type = CLOSED;         // override
    option features.(pb.test).file_feature = VALUE5;
    option features.(pb.test).source_feature = VALUE6;
  )schema");
  ASSERT_THAT(file, NotNull());

  EXPECT_THAT(TestGenerator::GetUnresolvedSourceFeatures(*file, pb::test),
              google::protobuf::EqualsProto(R"pb(
                file_feature: VALUE5
                source_feature: VALUE6
              )pb"));
}